

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

double RDL_getNofRC(RDL_data *data)

{
  double dVar1;
  uint local_2c;
  uint i;
  double intermediate;
  double result;
  RDL_data *data_local;
  
  intermediate = 0.0;
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    data_local = (RDL_data *)0x7fefffffffffffff;
  }
  else {
    for (local_2c = 0; local_2c < data->nofURFs; local_2c = local_2c + 1) {
      dVar1 = RDL_getNofRCForURF(data,local_2c);
      if ((dVar1 == 1.79769313486232e+308) && (!NAN(dVar1))) {
        return 1.79769313486232e+308;
      }
      intermediate = dVar1 + intermediate;
    }
    data_local = (RDL_data *)intermediate;
  }
  return (double)data_local;
}

Assistant:

double RDL_getNofRC(const RDL_data *data)
{
  double result = 0, intermediate;
  unsigned i;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return RDL_INVALID_RC_COUNT;
  }

  /* add up results for URFs */
  for (i = 0; i < data->nofURFs; ++i) {
    intermediate = RDL_getNofRCForURF(data, i);
    if (intermediate == RDL_INVALID_RC_COUNT) {
      return RDL_INVALID_RC_COUNT;
    }

    result += intermediate;
  }

  return result;
}